

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintExdc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int fPrintDc;
  int c;
  int fShort;
  double Percentage;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"sdh"), iVar2 != -1) {
    if (iVar2 == 100) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else if ((iVar2 == 0x68) || (iVar2 != 0x73)) {
      Abc_Print(-2,"usage: print_exdc [-dh]\n");
      Abc_Print(-2,"\t        prints the EXDC network statistics\n");
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-d    : toggles printing don\'t-care percentage [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      return 1;
    }
  }
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    return 1;
  }
  if (pAVar3->pExdc == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Network has no EXDC.\n");
    return 1;
  }
  if (bVar1) {
    iVar2 = Abc_NtkIsStrash(pAVar3->pExdc);
    if (iVar2 == 0) {
      pNtk_00 = Abc_NtkStrash(pAVar3->pExdc,0,0,0);
      pAVar4 = Abc_NtkPo(pNtk_00,0);
      pAVar4 = Abc_ObjChild0(pAVar4);
      _c = Abc_NtkSpacePercentage(pAVar4);
      Abc_NtkDelete(pNtk_00);
    }
    else {
      pAVar4 = Abc_NtkPo(pAVar3->pExdc,0);
      pAVar4 = Abc_ObjChild0(pAVar4);
      _c = Abc_NtkSpacePercentage(pAVar4);
    }
    Abc_Print(1,"EXDC network statistics: ");
    Abc_Print(1,"(");
    if ((_c <= 0.05) || (99.95 <= _c)) {
      if ((_c <= 5e-06) || (99.999995 <= _c)) {
        Abc_Print(1,"%f",_c);
      }
      else {
        Abc_Print(1,"%.6f",_c);
      }
    }
    else {
      Abc_Print(1,"%.2f",_c);
    }
    Abc_Print(1," %% don\'t-cares)\n");
  }
  else {
    Abc_Print(1,"EXDC network statistics: \n");
  }
  Abc_NtkPrintStats(pAVar3->pExdc,0,0,0,0,0,0,0,0,0,0);
  return 0;
}

Assistant:

int Abc_CommandPrintExdc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp;
    double Percentage;
    int fShort;
    int c;
    int fPrintDc;
    extern double Abc_NtkSpacePercentage( Abc_Obj_t * pNode );
    pNtk = Abc_FrameReadNtk(pAbc);

    // set the defaults
    fShort  = 1;
    fPrintDc = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sdh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fShort ^= 1;
            break;
        case 'd':
            fPrintDc ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( pNtk->pExdc == NULL )
    {
        Abc_Print( -1, "Network has no EXDC.\n" );
        return 1;
    }

    if ( fPrintDc )
    {
        if ( !Abc_NtkIsStrash(pNtk->pExdc) )
        {
            pNtkTemp = Abc_NtkStrash(pNtk->pExdc, 0, 0, 0);
            Percentage = Abc_NtkSpacePercentage( Abc_ObjChild0( Abc_NtkPo(pNtkTemp, 0) ) );
            Abc_NtkDelete( pNtkTemp );
        }
        else
            Percentage = Abc_NtkSpacePercentage( Abc_ObjChild0( Abc_NtkPo(pNtk->pExdc, 0) ) );

        Abc_Print( 1, "EXDC network statistics: " );
        Abc_Print( 1, "(" );
        if ( Percentage > 0.05 && Percentage < 99.95 )
            Abc_Print( 1, "%.2f", Percentage );
        else if ( Percentage > 0.000005 && Percentage < 99.999995 )
            Abc_Print( 1, "%.6f", Percentage );
        else
            Abc_Print( 1, "%f", Percentage );
        Abc_Print( 1, " %% don't-cares)\n" );
    }
    else
        Abc_Print( 1, "EXDC network statistics: \n" );
    Abc_NtkPrintStats( pNtk->pExdc, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: print_exdc [-dh]\n" );
    Abc_Print( -2, "\t        prints the EXDC network statistics\n" );
    Abc_Print( -2, "\t-d    : toggles printing don't-care percentage [default = %s]\n", fPrintDc? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}